

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

void tcg_exec_init_arm(uc_struct_conflict1 *uc,uint32_t tb_size)

{
  uint uVar1;
  TCGContext_conflict *pTVar2;
  void *addr;
  void **ppvVar3;
  uint uVar4;
  int iVar5;
  TCGContext_conflict *tcg_ctx;
  void *pvVar6;
  size_t size;
  size_t __len;
  
  pTVar2 = (TCGContext_conflict *)g_malloc(0x9f50);
  uc->tcg_ctx = pTVar2;
  tcg_context_init_arm(pTVar2);
  uc->tcg_ctx->uc = uc;
  page_size_init_arm(uc);
  iVar5 = uc->init_target_page->bits;
  if (iVar5 == 0) {
    __assert_fail("TARGET_PAGE_BITS",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                  ,0xab,"void page_table_config_init(struct uc_struct *)");
  }
  uVar1 = (0x28 - iVar5) % 10;
  uVar4 = uVar1 + 10;
  if (3 < uVar1) {
    uVar4 = uVar1;
  }
  uc->v_l1_size = 1 << ((byte)uVar4 & 0x1f);
  iVar5 = 0x28 - (iVar5 + uVar4);
  uc->v_l1_shift = iVar5;
  uc->v_l2_levels = iVar5 / 10 + -1;
  if (0xd < uVar4) {
    __assert_fail("v_l1_bits <= V_L1_MAX_BITS",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                  ,0xb6,"void page_table_config_init(struct uc_struct *)");
  }
  if (iVar5 % 10 != 0) {
    __assert_fail("uc->v_l1_shift % V_L2_BITS == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                  ,0xb7,"void page_table_config_init(struct uc_struct *)");
  }
  if (9 < iVar5) {
    qht_init(&(uc->tcg_ctx->tb_ctx).htable,tb_cmp,0x8000,1);
    pTVar2 = uc->tcg_ctx;
    uVar1 = 0x100000;
    if (0x100000 < tb_size) {
      uVar1 = tb_size;
    }
    if (0x7fffffff < uVar1) {
      uVar1 = 0x80000000;
    }
    __len = 0x40000000;
    if (tb_size != 0) {
      __len = (size_t)uVar1;
    }
    pTVar2->code_gen_buffer_size = __len;
    addr = mmap64((void *)0x0,__len,7,0x22,-1,0);
    pvVar6 = (void *)0x0;
    if (addr != (void *)0xffffffffffffffff) {
      qemu_madvise(addr,__len,0xe);
      pvVar6 = addr;
    }
    pTVar2->code_gen_buffer = pvVar6;
    pTVar2->initial_buffer = pvVar6;
    pTVar2->initial_buffer_size = pTVar2->code_gen_buffer_size;
    uc->tcg_buffer_size = (uint32_t)pTVar2->code_gen_buffer_size;
    if (pvVar6 != (void *)0x0) {
      tcg_prologue_init_arm(uc->tcg_ctx);
      ppvVar3 = (void **)g_malloc0(0x10000);
      uc->l1_map = ppvVar3;
      uc->uc_invalidate_tb = uc_invalidate_tb;
      uc->uc_gen_tb = uc_gen_tb;
      uc->tb_flush_arm = uc_tb_flush;
      uc->add_inline_hook = uc_add_inline_hook_arm;
      uc->del_inline_hook = uc_del_inline_hook_arm;
      return;
    }
    fwrite("Could not allocate dynamic translator buffer\n",0x2d,1,_stderr);
    exit(1);
  }
  __assert_fail("uc->v_l2_levels >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                ,0xb8,"void page_table_config_init(struct uc_struct *)");
}

Assistant:

void tcg_exec_init(struct uc_struct *uc, uint32_t tb_size)
{
    /* remove tcg object. init here. */
    /* tcg class init: tcg-all.c:tcg_accel_class_init(), skip all. */
    /* tcg object init: tcg-all.c:tcg_accel_instance_init(), skip all. */
    /* tcg init: tcg-all.c: tcg_init(), skip all. */
    /* run tcg_exec_init() here. */
    uc->tcg_ctx = g_malloc(sizeof(TCGContext));
    tcg_context_init(uc->tcg_ctx);
    uc->tcg_ctx->uc = uc;
    page_init(uc);
    tb_htable_init(uc);
    code_gen_alloc(uc, tb_size);
    tb_exec_unlock(uc->tcg_ctx);
    tcg_prologue_init(uc->tcg_ctx);
    /* cpu_interrupt_handler is not used in uc1 */
    uc->l1_map = g_malloc0(sizeof(void *) * V_L1_MAX_SIZE);
    /* Invalidate / Cache TBs */
    uc->uc_invalidate_tb = uc_invalidate_tb;
    uc->uc_gen_tb = uc_gen_tb;
    uc->tb_flush = uc_tb_flush;

    /* Inline hooks optimization */
    uc->add_inline_hook = uc_add_inline_hook;
    uc->del_inline_hook = uc_del_inline_hook;
}